

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O2

void __thiscall
slang::ast::ASTVisitor<always_ff_blocking::MainVisitor,_true,_false,_false,_false>::
visitDefault<slang::ast::ClassType>
          (ASTVisitor<always_ff_blocking::MainVisitor,_true,_false,_false,_false> *this,ClassType *t
          )

{
  iterator this_00;
  Symbol *member;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  sVar1;
  
  sVar1 = Scope::members(&t->super_Scope);
  for (this_00 = sVar1._M_begin.current; this_00.current != sVar1._M_end.current.current;
      this_00.current = (this_00.current)->nextInScope) {
    Symbol::visit<always_ff_blocking::MainVisitor&>(this_00.current,(MainVisitor *)this);
  }
  return;
}

Assistant:

void visitDefault(const T& t) {
        if constexpr (VisitExpressions && HasVisitExprs<T, TDerived>) {
            t.visitExprs(DERIVED);
        }
        else if constexpr (VisitExpressions && std::is_base_of_v<Symbol, T>) {
            if (auto declaredType = t.getDeclaredType()) {
                if (auto init = declaredType->getInitializer())
                    init->visit(DERIVED);
            }
        }

        if constexpr (VisitStatements && requires { t.visitStmts(DERIVED); }) {
            t.visitStmts(DERIVED);
        }

        if constexpr (std::is_base_of_v<GenericClassDefSymbol, T>) {
            for (auto&& spec : t.specializations())
                spec.visit(DERIVED);
        }

        if constexpr (std::is_base_of_v<Scope, T>) {
            for (auto& member : t.members())
                member.visit(DERIVED);
        }

        if constexpr (std::is_same_v<InstanceSymbol, T>) {
            if constexpr (VisitCanonical) {
                const auto& body = t.getCanonicalBody() ? *t.getCanonicalBody() : t.body;
                body.visit(DERIVED);
            }
            else {
                t.body.visit(DERIVED);
            }
        }

        if constexpr (std::is_same_v<CheckerInstanceSymbol, T>) {
            t.body.visit(DERIVED);
        }
    }